

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

int deqp::gles31::bb::anon_unknown_11::computeStd140BaseAlignment
              (VarType *type,deUint32 layoutFlags)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  int y;
  StructType *pSVar4;
  pointer this;
  VarType *pVVar5;
  int local_54;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_48;
  __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
  local_40;
  ConstIterator memberIter;
  int maxBaseAlignment;
  int elemAlignment;
  int vecAlign;
  int vecSize;
  bool isRowMajor;
  DataType basicType;
  int vec4Alignment;
  deUint32 layoutFlags_local;
  VarType *type_local;
  
  bVar1 = glu::VarType::isBasicType(type);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(type);
    bVar1 = glu::isDataTypeMatrix(DVar2);
    if (bVar1) {
      if ((layoutFlags & 0x10) == 0) {
        local_54 = glu::getDataTypeMatrixNumRows(DVar2);
      }
      else {
        local_54 = glu::getDataTypeMatrixNumColumns(DVar2);
      }
      DVar2 = glu::getDataTypeFloatVec(local_54);
      iVar3 = getDataTypeByteAlignment(DVar2);
      type_local._4_4_ = deAlign32(iVar3,0x10);
    }
    else {
      type_local._4_4_ = getDataTypeByteAlignment(DVar2);
    }
  }
  else {
    bVar1 = glu::VarType::isArrayType(type);
    if (bVar1) {
      pVVar5 = glu::VarType::getElementType(type);
      memberIter._M_current._4_4_ = computeStd140BaseAlignment(pVVar5,layoutFlags);
      type_local._4_4_ = deAlign32(memberIter._M_current._4_4_,0x10);
    }
    else {
      memberIter._M_current._0_4_ = 0;
      pSVar4 = glu::VarType::getStructPtr(type);
      local_40._M_current = (StructMember *)glu::StructType::begin(pSVar4);
      while( true ) {
        pSVar4 = glu::VarType::getStructPtr(type);
        local_48._M_current = (StructMember *)glu::StructType::end(pSVar4);
        bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
        iVar3 = (int)memberIter._M_current;
        if (!bVar1) break;
        this = __gnu_cxx::
               __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
               ::operator->(&local_40);
        pVVar5 = glu::StructMember::getType(this);
        y = computeStd140BaseAlignment(pVVar5,layoutFlags);
        memberIter._M_current._0_4_ = de::max<int>(iVar3,y);
        __gnu_cxx::
        __normal_iterator<const_glu::StructMember_*,_std::vector<glu::StructMember,_std::allocator<glu::StructMember>_>_>
        ::operator++(&local_40,0);
      }
      type_local._4_4_ = deAlign32((int)memberIter._M_current,0x10);
    }
  }
  return type_local._4_4_;
}

Assistant:

int computeStd140BaseAlignment (const VarType& type, deUint32 layoutFlags)
{
	const int vec4Alignment = (int)sizeof(deUint32)*4;

	if (type.isBasicType())
	{
		glu::DataType basicType = type.getBasicType();

		if (glu::isDataTypeMatrix(basicType))
		{
			const bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			const int	vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
												 : glu::getDataTypeMatrixNumRows(basicType);
			const int	vecAlign	= deAlign32(getDataTypeByteAlignment(glu::getDataTypeFloatVec(vecSize)), vec4Alignment);

			return vecAlign;
		}
		else
			return getDataTypeByteAlignment(basicType);
	}
	else if (type.isArrayType())
	{
		int elemAlignment = computeStd140BaseAlignment(type.getElementType(), layoutFlags);

		// Round up to alignment of vec4
		return deAlign32(elemAlignment, vec4Alignment);
	}
	else
	{
		DE_ASSERT(type.isStructType());

		int maxBaseAlignment = 0;

		for (StructType::ConstIterator memberIter = type.getStructPtr()->begin(); memberIter != type.getStructPtr()->end(); memberIter++)
			maxBaseAlignment = de::max(maxBaseAlignment, computeStd140BaseAlignment(memberIter->getType(), layoutFlags));

		return deAlign32(maxBaseAlignment, vec4Alignment);
	}
}